

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range_core.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
boost::
copy_range<std::__cxx11::string,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
          (iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *r)

{
  type __beg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa8;
  allocator<char> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd8;
  
  range_adl_barrier::
  begin<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
            (in_stack_ffffffffffffffa8);
  __beg = range_adl_barrier::
          end<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                    (in_stack_ffffffffffffffa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            (in_stack_ffffffffffffffd0,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__beg._M_current,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdf);
  return in_RDI;
}

Assistant:

inline SeqT copy_range( const Range& r )
        {
            return SeqT( boost::begin( r ), boost::end( r ) );
        }